

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestReadCustomFilesCommand.h
# Opt level: O2

void __thiscall
cmCTestReadCustomFilesCommand::~cmCTestReadCustomFilesCommand(cmCTestReadCustomFilesCommand *this)

{
  cmCommand::~cmCommand((cmCommand *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

cmCTestReadCustomFilesCommand() {}